

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall dap::WriteMemoryRequest::WriteMemoryRequest(WriteMemoryRequest *this)

{
  (this->allowPartial).val = false;
  (this->allowPartial).set = false;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->memoryReference)._M_dataplus._M_p = (pointer)&(this->memoryReference).field_2;
  (this->memoryReference)._M_string_length = 0;
  (this->memoryReference).field_2._M_local_buf[0] = '\0';
  (this->offset).val.val = 0;
  (this->offset).set = false;
  return;
}

Assistant:

inline boolean() : val(false) {}